

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_asin>(Mat *a,Option *opt)

{
  long *in_RDI;
  float fVar1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_asin op;
  Mat *m;
  __m128 final_approx;
  __m128 output_approx;
  __m128 fourth_power_of_input_approx;
  __m128 square_of_input_approx;
  __m128 input_approx;
  __m128 big_input_approx;
  __m128 is_big_input;
  __m128 is_small_input;
  __m128 absolute;
  __m128 negative_mask;
  __m128 magic_three;
  __m128 magic_half_pi;
  __m128 magic_a1;
  __m128 magic_a0;
  __m128 magic_a3;
  __m128 magic_a2;
  __m128 magic_a5;
  __m128 magic_a4;
  __m128 magic_one;
  __m128 magic_half_one;
  __m128 magic_negative_zero;
  ulong local_958;
  ulong uStack_950;
  int local_944;
  undefined8 local_940;
  undefined8 local_938;
  undefined8 local_930;
  undefined4 local_928;
  long local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined8 local_900;
  float *local_8f8;
  int local_8f0;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  undefined1 local_8d1 [9];
  long *local_8c8;
  undefined1 local_8bd;
  int local_8bc;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined8 *local_898;
  float *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  float *local_878;
  long local_870;
  undefined4 local_864;
  long local_860;
  float *local_858;
  undefined4 local_84c;
  int local_848;
  int local_844;
  undefined8 *local_840;
  undefined4 local_834;
  long local_830;
  undefined8 *local_820;
  ulong *local_7f8;
  undefined1 *local_7f0;
  float *local_7e8;
  undefined1 *local_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  ulong local_728;
  ulong uStack_720;
  undefined1 local_718 [16];
  ulong local_708;
  ulong uStack_700;
  uint local_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  ulong local_6e8;
  ulong uStack_6e0;
  ulong local_6d8;
  ulong uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  ulong local_618;
  ulong uStack_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined4 local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  ulong local_548;
  ulong uStack_540;
  ulong local_538;
  ulong uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  ulong local_518;
  ulong uStack_510;
  ulong local_508;
  ulong uStack_500;
  uint local_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  ulong local_4e8;
  ulong uStack_4e0;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 local_37c;
  ulong local_378;
  ulong uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  ulong local_358;
  ulong uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  ulong local_318;
  ulong uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  undefined8 *local_2c0;
  ulong *local_2b8;
  undefined8 *local_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  float *local_260;
  float *local_258;
  float *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  float *local_198;
  float *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 *local_140;
  undefined8 *local_138;
  float *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 *local_e0;
  float *local_d8;
  float *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 *local_80;
  undefined8 *local_78;
  float *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_8d8 = *(int *)((long)in_RDI + 0x2c);
  local_8dc = (int)in_RDI[6];
  local_8e0 = *(int *)((long)in_RDI + 0x34);
  local_8e4 = (int)in_RDI[7];
  local_8e8 = (int)in_RDI[3];
  local_8ec = local_8d8 * local_8dc * local_8e0 * local_8e8;
  local_8c8 = in_RDI;
  for (local_8f0 = 0; local_8f0 < local_8e4; local_8f0 = local_8f0 + 1) {
    local_8b0 = &local_940;
    local_844 = *(int *)((long)local_8c8 + 0x2c);
    local_848 = (int)local_8c8[6];
    local_84c = *(undefined4 *)((long)local_8c8 + 0x34);
    local_858 = (float *)(*local_8c8 + local_8c8[8] * (long)local_8f0 * local_8c8[2]);
    local_860 = local_8c8[2];
    local_864 = (undefined4)local_8c8[3];
    local_870 = local_8c8[4];
    local_840 = &local_940;
    local_830 = (long)local_844 * (long)local_848 * local_860;
    local_8a8 = &local_940;
    local_898 = &local_940;
    local_834 = 0x10;
    local_8bc = local_8f0;
    local_8bd = 1;
    local_940 = 0;
    local_930 = 0;
    local_928 = 0;
    local_918 = 0;
    local_914 = 0;
    local_910 = 0;
    local_90c = 0;
    local_908 = 0;
    local_900 = 0;
    local_938 = 0;
    local_8f8 = local_858;
    for (local_944 = 0; local_820 = local_898, local_920 = local_870, local_944 + 3 < local_8ec;
        local_944 = local_944 + 4) {
      local_890 = local_8f8;
      local_618 = *(ulong *)local_8f8;
      uStack_610 = *(ulong *)(local_8f8 + 2);
      local_7f0 = local_8d1;
      local_7f8 = &local_958;
      local_57c = 0x80000000;
      local_4bc = 0x80000000;
      local_4d8 = 0x80000000;
      local_628 = 0x8000000080000000;
      uStack_620 = 0x8000000080000000;
      local_580 = 0x3f000000;
      local_49c = 0x3f000000;
      local_4b8 = 0x3f000000;
      local_638 = 0x3f0000003f000000;
      uStack_630 = 0x3f0000003f000000;
      local_584 = 0x3f800000;
      local_47c = 0x3f800000;
      local_498 = 0x3f800000;
      local_648 = 0x3f8000003f800000;
      uStack_640 = 0x3f8000003f800000;
      local_588 = 0x3cc48f19;
      local_45c = 0x3cc48f19;
      local_478 = 0x3cc48f19;
      local_658 = 0x3cc48f193cc48f19;
      uStack_650 = 0x3cc48f193cc48f19;
      local_58c = 0x3d2dbdcf;
      local_43c = 0x3d2dbdcf;
      local_458 = 0x3d2dbdcf;
      local_668 = 0x3d2dbdcf3d2dbdcf;
      uStack_660 = 0x3d2dbdcf3d2dbdcf;
      local_590 = 0x3d997dcc;
      local_41c = 0x3d997dcc;
      local_438 = 0x3d997dcc;
      local_678 = 0x3d997dcc3d997dcc;
      uStack_670 = 0x3d997dcc3d997dcc;
      local_594 = 0x3d3a73d8;
      local_3fc = 0x3d3a73d8;
      local_418 = 0x3d3a73d8;
      local_688 = 0x3d3a73d83d3a73d8;
      uStack_680 = 0x3d3a73d83d3a73d8;
      local_598 = 0x3f800000;
      local_3dc = 0x3f800000;
      local_3f8 = 0x3f800000;
      local_698 = 0x3f8000003f800000;
      uStack_690 = 0x3f8000003f800000;
      local_59c = 0x3e2aaaf8;
      local_3bc = 0x3e2aaaf8;
      local_3d8 = 0x3e2aaaf8;
      local_6a8 = 0x3e2aaaf83e2aaaf8;
      uStack_6a0 = 0x3e2aaaf83e2aaaf8;
      local_5a0 = 0x3fc90fdb;
      local_39c = 0x3fc90fdb;
      local_3b8 = 0x3fc90fdb;
      local_6b8 = 0x3fc90fdb3fc90fdb;
      uStack_6b0 = 0x3fc90fdb3fc90fdb;
      local_5a4 = 0x40400000;
      local_37c = 0x40400000;
      local_398 = 0x40400000;
      local_6c8 = 0x4040000040400000;
      uStack_6c0 = 0x4040000040400000;
      local_6d8 = local_618 & 0x8000000080000000;
      uStack_6d0 = uStack_610 & 0x8000000080000000;
      local_6e8 = local_618 & 0x7fffffff7fffffff;
      uStack_6e0 = uStack_610 & 0x7fffffff7fffffff;
      local_18._0_4_ = (float)local_6e8;
      local_18._4_4_ = (float)(local_6e8 >> 0x20);
      uStack_10._0_4_ = (float)uStack_6e0;
      uStack_10._4_4_ = (float)(uStack_6e0 >> 0x20);
      local_6f8 = -(uint)((float)local_18 <= 0.5);
      uStack_6f4 = -(uint)(local_18._4_4_ <= 0.5);
      uStack_6f0 = -(uint)((float)uStack_10 <= 0.5);
      uStack_6ec = -(uint)(uStack_10._4_4_ <= 0.5);
      local_548 = CONCAT44(uStack_6f4,local_6f8);
      uStack_540 = CONCAT44(uStack_6ec,uStack_6f0);
      local_708 = ~local_548 & 0x3f8000003f800000;
      uStack_700 = ~uStack_540 & 0x3f8000003f800000;
      local_2f8 = 1.0 - (float)local_18;
      fStack_2f4 = 1.0 - local_18._4_4_;
      fStack_2f0 = 1.0 - (float)uStack_10;
      fStack_2ec = 1.0 - uStack_10._4_4_;
      local_2d8._0_4_ = local_2f8 * 0.5;
      local_2d8._4_4_ = fStack_2f4 * 0.5;
      local_2d8._8_4_ = fStack_2f0 * 0.5;
      local_2d8._12_4_ = fStack_2ec * 0.5;
      local_718 = sqrtps(local_2d8,local_2d8);
      local_5f8 = CONCAT44(uStack_6f4,local_6f8);
      uStack_5f0 = CONCAT44(uStack_6ec,uStack_6f0);
      local_4e8 = local_5f8 & local_6e8;
      uStack_4e0 = uStack_5f0 & uStack_6e0;
      local_568 = CONCAT44(uStack_6f4,local_6f8);
      uStack_560 = CONCAT44(uStack_6ec,uStack_6f0);
      local_578._0_4_ = local_718._0_4_;
      local_578._4_4_ = local_718._4_4_;
      uStack_570._0_4_ = local_718._8_4_;
      uStack_570._4_4_ = local_718._12_4_;
      local_4f8 = (local_6f8 ^ 0xffffffff) & (uint)local_578;
      uStack_4f4 = (uStack_6f4 ^ 0xffffffff) & local_578._4_4_;
      uStack_4f0 = (uStack_6f0 ^ 0xffffffff) & (uint)uStack_570;
      uStack_4ec = (uStack_6ec ^ 0xffffffff) & uStack_570._4_4_;
      local_728 = local_4e8 | CONCAT44(uStack_4f4,local_4f8);
      uStack_720 = uStack_4e0 | CONCAT44(uStack_4ec,uStack_4f0);
      local_308._0_4_ = (float)local_728;
      local_308._4_4_ = (float)(local_728 >> 0x20);
      uStack_300._0_4_ = (float)uStack_720;
      uStack_300._4_4_ = (float)(uStack_720 >> 0x20);
      local_738 = (float)local_308 * (float)local_308;
      fStack_734 = local_308._4_4_ * local_308._4_4_;
      fStack_730 = (float)uStack_300 * (float)uStack_300;
      fStack_72c = uStack_300._4_4_ * uStack_300._4_4_;
      local_328 = CONCAT44(fStack_734,local_738);
      uStack_320 = CONCAT44(fStack_72c,fStack_730);
      local_338 = CONCAT44(fStack_734,local_738);
      uStack_330 = CONCAT44(fStack_72c,fStack_730);
      local_748 = local_738 * local_738;
      fStack_744 = fStack_734 * fStack_734;
      fStack_740 = fStack_730 * fStack_730;
      fStack_73c = fStack_72c * fStack_72c;
      local_70 = &local_748;
      local_78 = &local_668;
      local_80 = &local_688;
      local_58 = CONCAT44(fStack_744,local_748);
      uStack_50 = CONCAT44(fStack_73c,fStack_740);
      local_68 = 0x3d2dbdcf3d2dbdcf;
      uStack_60 = 0x3d2dbdcf3d2dbdcf;
      local_38 = local_748 * 0.042417344;
      fStack_34 = fStack_744 * 0.042417344;
      fStack_30 = fStack_740 * 0.042417344;
      fStack_2c = fStack_73c * 0.042417344;
      local_48 = 0x3d3a73d83d3a73d8;
      uStack_40 = 0x3d3a73d83d3a73d8;
      local_778 = local_38 + 0.045520633;
      fStack_774 = fStack_34 + 0.045520633;
      fStack_770 = fStack_30 + 0.045520633;
      fStack_76c = fStack_2c + 0.045520633;
      local_d0 = &local_748;
      local_d8 = &local_778;
      local_e0 = &local_6a8;
      local_b8 = CONCAT44(fStack_744,local_748);
      uStack_b0 = CONCAT44(fStack_73c,fStack_740);
      local_c8 = CONCAT44(fStack_774,local_778);
      uStack_c0 = CONCAT44(fStack_76c,fStack_770);
      local_98 = local_748 * local_778;
      fStack_94 = fStack_744 * fStack_774;
      fStack_90 = fStack_740 * fStack_770;
      fStack_8c = fStack_73c * fStack_76c;
      local_a8 = 0x3e2aaaf83e2aaaf8;
      uStack_a0 = 0x3e2aaaf83e2aaaf8;
      local_768 = local_98 + 0.16666782;
      fStack_764 = fStack_94 + 0.16666782;
      fStack_760 = fStack_90 + 0.16666782;
      fStack_75c = fStack_8c + 0.16666782;
      local_130 = &local_748;
      local_138 = &local_658;
      local_140 = &local_678;
      local_118 = CONCAT44(fStack_744,local_748);
      uStack_110 = CONCAT44(fStack_73c,fStack_740);
      local_128 = 0x3cc48f193cc48f19;
      uStack_120 = 0x3cc48f193cc48f19;
      local_f8 = local_748 * 0.023994016;
      fStack_f4 = fStack_744 * 0.023994016;
      fStack_f0 = fStack_740 * 0.023994016;
      fStack_ec = fStack_73c * 0.023994016;
      local_108 = 0x3d997dcc3d997dcc;
      uStack_100 = 0x3d997dcc3d997dcc;
      local_798 = local_f8 + 0.07494697;
      fStack_794 = fStack_f4 + 0.07494697;
      fStack_790 = fStack_f0 + 0.07494697;
      fStack_78c = fStack_ec + 0.07494697;
      local_190 = &local_748;
      local_198 = &local_798;
      local_1a0 = &local_698;
      local_178 = CONCAT44(fStack_744,local_748);
      uStack_170 = CONCAT44(fStack_73c,fStack_740);
      local_188 = CONCAT44(fStack_794,local_798);
      uStack_180 = CONCAT44(fStack_78c,fStack_790);
      local_158 = local_748 * local_798;
      fStack_154 = fStack_744 * fStack_794;
      fStack_150 = fStack_740 * fStack_790;
      fStack_14c = fStack_73c * fStack_78c;
      local_168 = 0x3f8000003f800000;
      uStack_160 = 0x3f8000003f800000;
      local_788 = local_158 + 1.0;
      fStack_784 = fStack_154 + 1.0;
      fStack_780 = fStack_150 + 1.0;
      fStack_77c = fStack_14c + 1.0;
      local_1f0 = &local_738;
      local_1f8 = &local_768;
      local_200 = &local_788;
      local_1d8 = CONCAT44(fStack_734,local_738);
      uStack_1d0 = CONCAT44(fStack_72c,fStack_730);
      local_1e8 = CONCAT44(fStack_764,local_768);
      uStack_1e0 = CONCAT44(fStack_75c,fStack_760);
      local_1b8 = local_738 * local_768;
      fStack_1b4 = fStack_734 * fStack_764;
      fStack_1b0 = fStack_730 * fStack_760;
      fStack_1ac = fStack_72c * fStack_75c;
      local_1c8 = CONCAT44(fStack_784,local_788);
      uStack_1c0 = CONCAT44(fStack_77c,fStack_780);
      local_758 = local_1b8 + local_788;
      fStack_754 = fStack_1b4 + fStack_784;
      fStack_750 = fStack_1b0 + fStack_780;
      fStack_74c = fStack_1ac + fStack_77c;
      local_348 = CONCAT44(fStack_754,local_758);
      uStack_340 = CONCAT44(fStack_74c,fStack_750);
      local_7b8 = local_758 * (float)local_308;
      fStack_7b4 = fStack_754 * local_308._4_4_;
      fStack_7b0 = fStack_750 * (float)uStack_300;
      fStack_7ac = fStack_74c * uStack_300._4_4_;
      local_2b0 = &local_6c8;
      local_2b8 = &local_708;
      local_2c0 = &local_648;
      local_298 = 0x3f8000003f800000;
      uStack_290 = 0x3f8000003f800000;
      local_278 = 0x40400000;
      uStack_274 = 0x40400000;
      uStack_270 = 0x40400000;
      uStack_26c = 0x40400000;
      local_288._0_4_ = (float)local_708;
      local_288._4_4_ = (float)(local_708 >> 0x20);
      uStack_280._0_4_ = (float)uStack_700;
      uStack_280._4_4_ = (float)(uStack_700 >> 0x20);
      local_2a8 = (float)local_288 * 3.0;
      fStack_2a4 = local_288._4_4_ * 3.0;
      fStack_2a0 = (float)uStack_280 * 3.0;
      fStack_29c = uStack_280._4_4_ * 3.0;
      local_7c8 = 1.0 - local_2a8;
      fStack_7c4 = 1.0 - fStack_2a4;
      fStack_7c0 = 1.0 - fStack_2a0;
      fStack_7bc = 1.0 - fStack_29c;
      local_7d8 = (float)local_288 * 1.5707964;
      fStack_7d4 = local_288._4_4_ * 1.5707964;
      fStack_7d0 = (float)uStack_280 * 1.5707964;
      fStack_7cc = uStack_280._4_4_ * 1.5707964;
      local_250 = &local_7b8;
      local_258 = &local_7c8;
      local_260 = &local_7d8;
      local_238 = CONCAT44(fStack_7b4,local_7b8);
      uStack_230 = CONCAT44(fStack_7ac,fStack_7b0);
      local_248 = CONCAT44(fStack_7c4,local_7c8);
      uStack_240 = CONCAT44(fStack_7bc,fStack_7c0);
      local_218 = local_7b8 * local_7c8;
      fStack_214 = fStack_7b4 * fStack_7c4;
      fStack_210 = fStack_7b0 * fStack_7c0;
      fStack_20c = fStack_7ac * fStack_7bc;
      local_228 = CONCAT44(fStack_7d4,local_7d8);
      uStack_220 = CONCAT44(fStack_7cc,fStack_7d0);
      local_7a8 = local_218 + local_7d8;
      fStack_7a4 = fStack_214 + fStack_7d4;
      fStack_7a0 = fStack_210 + fStack_7d0;
      fStack_79c = fStack_20c + fStack_7cc;
      local_508 = CONCAT44(fStack_7a4,local_7a8);
      uStack_500 = CONCAT44(fStack_79c,fStack_7a0);
      local_958 = local_508 | local_6d8;
      uStack_950 = uStack_500 | uStack_6d0;
      local_878 = local_8f8;
      local_888._0_4_ = (float)local_958;
      local_888._4_4_ = (float)(local_958 >> 0x20);
      uStack_880._0_4_ = (float)uStack_950;
      uStack_880._4_4_ = (float)(uStack_950 >> 0x20);
      *local_8f8 = (float)local_888;
      local_8f8[1] = local_888._4_4_;
      local_8f8[2] = (float)uStack_880;
      local_8f8[3] = uStack_880._4_4_;
      local_8f8 = local_8f8 + 4;
      local_888 = local_958;
      uStack_880 = uStack_950;
      local_608 = local_6e8;
      uStack_600 = uStack_6e0;
      local_5e8 = local_618;
      uStack_5e0 = uStack_610;
      local_5d8 = local_628;
      uStack_5d0 = uStack_620;
      local_5c8 = local_6e8;
      uStack_5c0 = uStack_6e0;
      local_5b8 = local_648;
      uStack_5b0 = uStack_640;
      local_578 = local_718._0_8_;
      uStack_570 = local_718._8_8_;
      local_558 = local_648;
      uStack_550 = uStack_640;
      local_538 = local_618;
      uStack_530 = uStack_610;
      local_528 = local_628;
      uStack_520 = uStack_620;
      local_518 = local_6d8;
      uStack_510 = uStack_6d0;
      uStack_4d4 = local_4d8;
      uStack_4d0 = local_4d8;
      uStack_4cc = local_4d8;
      uStack_4b4 = local_4b8;
      uStack_4b0 = local_4b8;
      uStack_4ac = local_4b8;
      uStack_494 = local_498;
      uStack_490 = local_498;
      uStack_48c = local_498;
      uStack_474 = local_478;
      uStack_470 = local_478;
      uStack_46c = local_478;
      uStack_454 = local_458;
      uStack_450 = local_458;
      uStack_44c = local_458;
      uStack_434 = local_438;
      uStack_430 = local_438;
      uStack_42c = local_438;
      uStack_414 = local_418;
      uStack_410 = local_418;
      uStack_40c = local_418;
      uStack_3f4 = local_3f8;
      uStack_3f0 = local_3f8;
      uStack_3ec = local_3f8;
      uStack_3d4 = local_3d8;
      uStack_3d0 = local_3d8;
      uStack_3cc = local_3d8;
      uStack_3b4 = local_3b8;
      uStack_3b0 = local_3b8;
      uStack_3ac = local_3b8;
      uStack_394 = local_398;
      uStack_390 = local_398;
      uStack_38c = local_398;
      local_378 = local_708;
      uStack_370 = uStack_700;
      local_368 = local_6b8;
      uStack_360 = uStack_6b0;
      local_358 = local_728;
      uStack_350 = uStack_720;
      local_318 = local_728;
      uStack_310 = uStack_720;
      local_308 = local_728;
      uStack_300 = uStack_720;
      local_2e8 = local_638;
      uStack_2e0 = uStack_630;
      local_288 = local_708;
      uStack_280 = uStack_700;
      local_28 = local_638;
      uStack_20 = uStack_630;
      local_18 = local_6e8;
      uStack_10 = uStack_6e0;
    }
    for (; local_944 < local_8ec; local_944 = local_944 + 1) {
      local_7e0 = local_8d1;
      local_7e8 = local_8f8;
      fVar1 = asinf(*local_8f8);
      *local_8f8 = fVar1;
      local_8f8 = local_8f8 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}